

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<int,_std::greater<void>_>::fill_counters
          (k_ary_search_set<int,_std::greater<void>_> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters)

{
  pointer puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t this_00;
  size_t sVar5;
  unsigned_long *puVar6;
  size_type sVar7;
  reference pvVar8;
  unsigned_long local_60;
  unsigned_long local_58;
  ulong local_50;
  size_t i;
  long local_40;
  size_t elements_in_last_row;
  size_t max_subtree_elements;
  size_t min_subtree_elements;
  size_t max_subtree_height;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *counters_local;
  k_ary_search_set_branch *branch_local;
  k_ary_search_set<int,_std::greater<void>_> *this_local;
  
  min_subtree_elements = branch->height - 1;
  max_subtree_height = (size_t)counters;
  counters_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)branch;
  branch_local = (k_ary_search_set_branch *)this;
  max_subtree_elements = perfect_tree_size(this->m_arity,branch->height - 2);
  elements_in_last_row = perfect_tree_size(this->m_arity,min_subtree_elements);
  puVar1 = (counters_local->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  sVar5 = perfect_tree_size(this->m_arity,
                            (long)(counters_local->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - 1);
  this_00 = max_subtree_height;
  local_40 = (long)puVar1 - sVar5;
  i = (long)(counters_local->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish + 1;
  puVar6 = std::min<unsigned_long>(&this->m_arity,&i);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,*puVar6);
  local_50 = 0;
  while( true ) {
    uVar3 = local_50;
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)max_subtree_height);
    uVar4 = local_50;
    if (sVar7 <= uVar3) break;
    local_58 = (local_50 + 1) * max_subtree_elements + local_40;
    local_60 = (local_50 + 1) * elements_in_last_row;
    puVar6 = std::min<unsigned_long>(&local_58,&local_60);
    uVar2 = *puVar6;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)max_subtree_height,
                        local_50);
    *pvVar8 = uVar4 + uVar2;
    local_50 = local_50 + 1;
  }
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)max_subtree_height);
  if ((pointer)*pvVar8 ==
      (counters_local->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  __assert_fail("counters.back() == branch.size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x197,
                "void burst::k_ary_search_set<int, std::greater<void>>::fill_counters(const k_ary_search_set_branch &, std::vector<std::size_t> &) [Value = int, Compare = std::greater<void>]"
               );
}

Assistant:

void
            fill_counters
            (
                const k_ary_search_set_branch & branch,
                std::vector<std::size_t> & counters
            )
        {
            const std::size_t max_subtree_height = branch.height - 1;
            const std::size_t min_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height - 1);
            const std::size_t max_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height);
            const std::size_t elements_in_last_row =
                branch.size - perfect_tree_size(m_arity, branch.height - 1);

            counters.resize(std::min(m_arity, branch.size + 1));
            for (std::size_t i = 0; i < counters.size(); ++i)
            {
                counters[i] = i + std::min
                (
                    (i + 1) * min_subtree_elements + elements_in_last_row,
                    (i + 1) * max_subtree_elements
                );
            }
            BOOST_ASSERT(counters.back() == branch.size);
        }